

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void build_er_1(m68k_info *info,int opcode,uint8_t size)

{
  cs_m68k *op;
  undefined7 in_register_00000011;
  uint size_00;
  
  size_00 = (uint)CONCAT71(in_register_00000011,size);
  op = build_init_op(info,opcode,2,size_00);
  get_ea_mode_op(info,op->operands,info->ir,size_00);
  op->operands[1].address_mode = M68K_AM_REG_DIRECT_DATA;
  op->operands[1].field_0.reg = (info->ir >> 9 & 7) + M68K_REG_D0;
  return;
}

Assistant:

static void build_er_1(m68k_info *info, int opcode, uint8_t size)
{
	build_er_gen_1(info, true, opcode, size);
}